

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

QHttp2Stream * __thiscall
QHttp2ProtocolHandler::createNewStream
          (QHttp2ProtocolHandler *this,HttpMessagePair *message,bool uploadDone)

{
  bool bVar1;
  CreateStreamError CVar2;
  QHttp2Stream *signal;
  QDebug *o;
  QHttp2Stream *sender;
  ContextType *context;
  byte in_DL;
  undefined1 extraout_DL;
  ContextType *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReply *reply;
  QNonContiguousByteDevice *src;
  QHttp2Stream *stream;
  char *cstr;
  QHttpNetworkReply *reply_1;
  QHttp2Stream *promisedStream;
  QString errorString;
  QUrl streamKey;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> streamResult;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 uVar3;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  QHttp2Connection *in_stack_fffffffffffffe78;
  NetworkError _t1;
  ConnectionType type;
  QHttp2Connection *in_stack_fffffffffffffe80;
  int fieldWidth;
  QString *in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe98 [16];
  char *in_stack_fffffffffffffeb8;
  QChar fillChar;
  ConnectionType in_stack_ffffffffffffff00;
  HttpMessagePair *message_00;
  QHttp2ProtocolHandler *in_stack_ffffffffffffff18;
  Connection local_c0;
  QChar local_b6;
  CreateStreamError local_b4;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  QHttp2Stream *in_stack_ffffffffffffff98;
  QDebug local_48;
  QDebug local_40;
  QDebug local_38;
  QUrl local_30;
  undefined8 local_28;
  ulong local_20;
  QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_657c77::urlkey_from_request((QHttpNetworkRequest *)in_stack_fffffffffffffe78);
  signal = QHttp2Connection::promisedStream
                     (in_stack_fffffffffffffe78,
                      (QUrl *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  if (signal == (QHttp2Stream *)0x0) {
    local_18 = (QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
               0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    local_18 = QHttp2Connection::createStream(in_stack_fffffffffffffe80);
    local_10 = CONCAT71(local_10._1_7_,extraout_DL);
    bVar1 = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::ok
                      ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)0x2d1d8d)
    ;
    if (bVar1) {
      sender = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::unwrap
                         ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                          0x2d1fef);
      type = (ConnectionType)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      if (((in_DL & 1) == 0) &&
         (context = (ContextType *)
                    QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x2d200f),
         context != (ContextType *)0x0)) {
        uVar3 = 0;
        QObject::connect<void(QObject::*)(QObject*),void(QHttp2ProtocolHandler::*)(QObject*)>
                  (&sender->super_QObject,(offset_in_QObject_to_subr)signal,context,
                   (offset_in_QHttp2ProtocolHandler_to_subr *)0x0,in_stack_ffffffffffffff00);
        QMetaObject::Connection::~Connection(&local_c0);
        in_stack_fffffffffffffe80 = (QHttp2Connection *)(in_RDI + 3);
        QPointer<QHttp2Stream>::QPointer<void>
                  ((QPointer<QHttp2Stream> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (QHttp2Stream *)CONCAT44(in_stack_fffffffffffffe6c,uVar3));
        QHash<QObject_*,_QPointer<QHttp2Stream>_>::insert
                  ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (QObject **)CONCAT44(in_stack_fffffffffffffe6c,uVar3),
                   (QPointer<QHttp2Stream> *)0x2d20d6);
        QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2d20ed);
      }
      message_00 = (HttpMessagePair *)0x0;
      QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
                (in_RDI,(offset_in_QHttpNetworkReply_to_subr *)in_stack_fffffffffffffe80,type);
      connectStream(in_stack_ffffffffffffff18,message_00,in_stack_ffffffffffffff98);
      signal = sender;
    }
    else {
      CVar2 = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::error
                        ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                         0x2d1da2);
      if (CVar2 == MaxConcurrentStreamsReached) {
        signal = (QHttp2Stream *)0x0;
      }
      else {
        local_28 = 0xaaaaaaaaaaaaaaaa;
        local_20 = 0xaaaaaaaaaaaaaaaa;
        QtPrivateLogging::QT_HTTP2();
        anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
          anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2d1e16);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe74,
                     (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (char *)0x2d1e2f);
          QMessageLogger::debug();
          o = QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffeb8);
          QDebug::QDebug(&local_40,o);
          QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::error
                    ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)0x2d1e75);
          ::operator<<(in_stack_fffffffffffffe98._0_8_,
                       (CreateStreamError)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          QDebug::~QDebug(&local_38);
          QDebug::~QDebug(&local_40);
          QDebug::~QDebug(&local_48);
          local_20 = local_20 & 0xffffffffffffff00;
        }
        local_80 = 0xaaaaaaaaaaaaaaaa;
        local_78 = 0xaaaaaaaaaaaaaaaa;
        local_70 = 0xaaaaaaaaaaaaaaaa;
        QCoreApplication::tr
                  ((char *)in_stack_fffffffffffffe78,
                   (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe6c);
        fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30);
        fieldWidth = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
        _t1 = (NetworkError)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        local_b4 = QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::error
                             ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)
                              0x2d1f35);
        QDebug::toString<QHttp2Connection::CreateStreamError>
                  ((CreateStreamError *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        QChar::QChar<char16_t,_true>(&local_b6,L' ');
        QString::arg<QString,_true>(in_stack_fffffffffffffe90,(QString *)in_RDI,fieldWidth,fillChar)
        ;
        QString::~QString((QString *)0x2d1f98);
        QString::~QString((QString *)0x2d1fa5);
        QHttpNetworkReply::finishedWithError
                  ((QHttpNetworkReply *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),_t1,
                   (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        signal = (QHttp2Stream *)0x0;
        QString::~QString((QString *)0x2d1fdd);
      }
    }
  }
  QUrl::~QUrl(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return signal;
}

Assistant:

QHttp2Stream *QHttp2ProtocolHandler::createNewStream(const HttpMessagePair &message,
                                                     bool uploadDone)
{
    QUrl streamKey = urlkey_from_request(message.first);
    if (auto promisedStream = h2Connection->promisedStream(streamKey)) {
        Q_ASSERT(promisedStream->state() != QHttp2Stream::State::Closed);
        return promisedStream;
    }

    QH2Expected<QHttp2Stream *, QHttp2Connection::CreateStreamError>
            streamResult = h2Connection->createStream();
    if (!streamResult.ok()) {
        if (streamResult.error()
            == QHttp2Connection::CreateStreamError::MaxConcurrentStreamsReached) {
            // We have to wait for a stream to be closed before we can create a new one, so
            // we just return nullptr, the caller should not remove it from the queue.
            return nullptr;
        }
        qCDebug(QT_HTTP2) << "failed to create new stream:" << streamResult.error();
        auto *reply = message.second;
        const char *cstr = "Failed to initialize HTTP/2 stream with errorcode: %1";
        const QString errorString = QCoreApplication::tr("QHttp", cstr)
                                            .arg(QDebug::toString(streamResult.error()));
        emit reply->finishedWithError(QNetworkReply::ProtocolFailure, errorString);
        return nullptr;
    }
    QHttp2Stream *stream = streamResult.unwrap();

    if (!uploadDone) {
        if (auto *src = message.first.uploadByteDevice()) {
            connect(src, &QObject::destroyed, this, &QHttp2ProtocolHandler::_q_uploadDataDestroyed);
            streamIDs.insert(src, stream);
        }
    }

    auto *reply = message.second;
    QMetaObject::invokeMethod(reply, &QHttpNetworkReply::requestSent, Qt::QueuedConnection);

    connectStream(message, stream);
    return stream;
}